

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageBitShift(StackInterpreter *this)

{
  long *plVar1;
  size_t sVar2;
  byte bVar3;
  long lVar4;
  Oop selector;
  long lVar5;
  long lVar6;
  
  plVar1 = (long *)(this->stack->stackFrame).stackPointer;
  if (((uint)*plVar1 & (uint)plVar1[1] & 1) != 0) {
    sVar2 = this->pc;
    lVar5 = plVar1[1] >> 1;
    lVar4 = *plVar1 >> 1;
    bVar3 = (byte)lVar4;
    this->pc = sVar2 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar2);
    lVar6 = lVar5 >> (-bVar3 & 0x3f);
    if (0 < lVar4) {
      lVar6 = lVar5 << (bVar3 & 0x3f);
    }
    (this->stack->stackFrame).stackPointer = (uint8_t *)(plVar1 + 1);
    plVar1[1] = lVar6 * 2 + 1;
    return;
  }
  selector = VMContext::getSpecialMessageSelector(this->context,BitShift);
  sendSelectorArgumentCount(this,selector,1,false);
  return;
}

Assistant:

void interpretSpecialMessageBitShift()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            auto result = ib > 0 ? ia << ib : ia >> (-ib);
            pushOop(Oop::encodeSmallInteger(result));
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::BitShift, 1);
        }

    }